

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

reg_object fitOCSB(double *x,int N,int f,int lag,int mlags)

{
  size_t __size;
  size_t __size_00;
  double dVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int N_00;
  double *oup;
  double *oup_00;
  double *__ptr;
  double *x_00;
  double *pdVar7;
  double *pdVar8;
  reg_object obj;
  long lVar9;
  double *__ptr_00;
  double *pdVar10;
  void *__src;
  double *pdVar11;
  double *pdVar12;
  void *__src_00;
  double *pdVar13;
  double *pdVar14;
  reg_object obj_00;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  size_t __size_01;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  double dStack_108;
  double var [2];
  int local_3c;
  int local_38;
  int ylcols;
  int ylrows;
  
  uVar2 = (ulong)(uint)mlags;
  __size = (long)N * 8;
  local_38 = lag;
  oup = (double *)malloc(__size);
  oup_00 = (double *)malloc(__size);
  dStack_108 = 0.0;
  var[0] = 0.0;
  iVar5 = diffs(x,N,1,f,oup);
  iVar6 = diff(oup,iVar5,1,oup_00);
  __ptr = genLags(oup_00,iVar6,local_38,&ylcols,&local_3c);
  iVar4 = ylcols;
  uVar19 = 0;
  if (mlags < 0) {
    mlags = 0;
  }
  iVar6 = iVar6 - mlags;
  lVar17 = (long)ylcols;
  lVar21 = (long)iVar6;
  __size_01 = lVar17 * lVar21 * 8;
  x_00 = (double *)malloc(__size_01);
  lVar18 = (long)local_3c;
  if (0 < iVar4) {
    uVar19 = (ulong)(uint)iVar4;
  }
  __size_00 = lVar21 * 8;
  pdVar7 = __ptr;
  pdVar8 = x_00;
  while (bVar22 = uVar19 != 0, uVar19 = uVar19 - 1, bVar22) {
    memcpy(pdVar8,pdVar7,__size_00);
    pdVar8 = pdVar8 + lVar21;
    pdVar7 = pdVar7 + lVar18;
  }
  lVar18 = lVar17 + 1;
  pdVar7 = (double *)malloc(lVar18 * lVar18 * 8);
  pdVar8 = (double *)malloc(__size_00);
  obj = reg_init(iVar6,(int)lVar18);
  regress(obj,x_00,oup_00 + uVar2,pdVar8,pdVar7,0.95);
  lVar9 = (long)local_38;
  uVar16 = iVar5 - local_38;
  __ptr_00 = genLags(oup,iVar5,local_38,&ylcols,&local_3c);
  lVar20 = (long)local_3c;
  pdVar10 = (double *)malloc(lVar20 * 8);
  __src = malloc((long)(int)uVar16 * 8);
  uVar19 = 0;
  uVar3 = ylcols;
  if (ylcols < 1) {
    uVar3 = 0;
  }
  if ((int)uVar16 < 1) {
    uVar16 = 0;
  }
  pdVar11 = __ptr_00;
  for (; uVar19 != uVar16; uVar19 = uVar19 + 1) {
    pdVar12 = pdVar11;
    for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
      pdVar10[uVar15] = *pdVar12;
      pdVar12 = pdVar12 + lVar20;
    }
    dVar1 = fitted(obj,pdVar10,pdVar7,&dStack_108);
    *(double *)((long)__src + uVar19 * 8) = oup[lVar9 + uVar19] - dVar1;
    pdVar11 = pdVar11 + 1;
  }
  free(pdVar10);
  pdVar10 = (double *)malloc(__size);
  N_00 = diff(x,N,1,pdVar10);
  iVar5 = local_38;
  pdVar11 = genLags(pdVar10,N_00,local_38,&ylcols,&local_3c);
  uVar16 = N_00 - iVar5;
  pdVar12 = (double *)malloc((long)local_3c * 8);
  __src_00 = malloc((long)(int)uVar16 * 8);
  uVar19 = 0;
  uVar3 = ylcols;
  if (ylcols < 1) {
    uVar3 = 0;
  }
  if ((int)uVar16 < 1) {
    uVar16 = 0;
  }
  pdVar14 = pdVar11;
  for (; uVar19 != uVar16; uVar19 = uVar19 + 1) {
    pdVar13 = pdVar14;
    for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
      pdVar12[uVar15] = *pdVar13;
      pdVar13 = pdVar13 + local_3c;
    }
    dVar1 = fitted(obj,pdVar12,pdVar7,&dStack_108);
    *(double *)((long)__src_00 + uVar19 * 8) = pdVar10[lVar9 + uVar19] - dVar1;
    pdVar14 = pdVar14 + 1;
  }
  lVar9 = lVar17 * 8 + 0x10;
  pdVar14 = (double *)malloc(lVar21 * lVar9);
  memcpy(pdVar14,x_00,__size_01);
  memcpy(pdVar14 + iVar4 * iVar6,__src,__size_00);
  memcpy(pdVar14 + iVar6 * (int)lVar18,__src_00,__size_00);
  free(pdVar7);
  free(pdVar8);
  obj_00 = reg_init(iVar6,(int)(lVar17 + 2));
  setIntercept(obj_00,0);
  pdVar7 = (double *)malloc((lVar17 + 2) * lVar9);
  pdVar8 = (double *)malloc(__size_00);
  regress(obj_00,pdVar14,oup_00 + uVar2,pdVar8,pdVar7,0.95);
  free(oup);
  free(pdVar7);
  free(__ptr);
  free(x_00);
  free(pdVar8);
  free_reg(obj);
  free(__ptr_00);
  free(pdVar12);
  free(oup_00);
  free(pdVar10);
  free(pdVar11);
  free(__src);
  free(__src_00);
  free(pdVar14);
  return obj_00;
}

Assistant:

reg_object fitOCSB(double *x, int N, int f, int lag, int mlags) {
    int i,j,Nyf,Ny, ylrows, ylcols,p;
    double *y_fdiff, *y, *ylag, *mf, *res, *varcovar;
    double *z4_y,*z4_lag,*z4_preds,*z4,*inp,*z5_y,*z5_lag,*z5_preds,*z5,*XX;
    double *y2,*z5_y2;
    int Nz4y,Nz5y,mfrows;
    double alpha;
    reg_object fit;
    reg_object fitout;

    y_fdiff = (double*)malloc(sizeof(double)*N);
    y = (double*)malloc(sizeof(double)*N);
    double var[2] = {0,0};

    Nyf = diffs(x,N,1,f,y_fdiff);
    Ny = diff(y_fdiff,Nyf,1,y);

    //mdisplay(y_fdiff,1,Nyf);
    //mdisplay(y,1,Ny);

    ylag = genLags(y,Ny,lag,&ylrows,&ylcols);

    //mdisplay(ylag,ylrows,ylcols);

    if (mlags > -1) {
        y2 = &y[mlags];
        Ny -= mlags;
    }

    //mdisplay(y,1,Ny);

    mf = (double*) malloc(sizeof(double)*ylrows*Ny);
    mfrows = ylrows;

    for(i = 0; i < ylrows;++i) {
        memcpy(mf+Ny*i,ylag+ylcols*i,sizeof(double)*Ny);
    }

    //mdisplay(mf,ylrows,Ny);

    p = ylrows + 1;
    varcovar = (double*)malloc(sizeof(double)*p*p);
    res = (double*)malloc(sizeof(double)*Ny);
    alpha = 0.95;
    fit = reg_init(Ny,p);

    regress(fit,mf,y2,res,varcovar,alpha);

    //summary(fit);
    //printf("loglik %g aic %g bic %g aicc %g \n",fit->loglik,fit->aic,fit->bic,fit->aicc);

    z4_y = &y_fdiff[lag];
    Nz4y = Nyf - lag;
    //mdisplay(z4_y,1,Nz4y);

    z4_lag = genLags(y_fdiff,Nyf,lag,&ylrows,&ylcols);

    //mdisplay(z4_lag,ylrows,ylcols);

    inp = (double*) malloc(sizeof(double)*ylcols);
    z4_preds = (double*) malloc(sizeof(double)*Nz4y);
    z4 = (double*) malloc(sizeof(double)*Nz4y);

    //printf("nz4y %d ylrows %d ylcols %d",Nz4y,ylrows,ylcols);

    for(i = 0; i < Nz4y;++i) {
        for(j = 0; j < ylrows;++j) {
            inp[j] = z4_lag[j*ylcols+i];
        }

        z4_preds[i] = fitted(fit,inp,varcovar,var);
        z4[i] = z4_y[i] - z4_preds[i];
    }

    free(inp);

    //mdisplay(z4_preds,1,Nz4y);

    z5_y = (double*)malloc(sizeof(double)*N);

    Nz5y = diff(x,N,1,z5_y);

    z5_lag = genLags(z5_y,Nz5y,lag,&ylrows,&ylcols);

    z5_y2 = &z5_y[lag];
    Nz5y -= lag;

    inp = (double*) malloc(sizeof(double)*ylcols);
    z5_preds = (double*) malloc(sizeof(double)*Nz5y);
    z5 = (double*) malloc(sizeof(double)*Nz5y);

    for(i = 0; i < Nz5y;++i) {
        for(j = 0; j < ylrows;++j) {
            inp[j] = z5_lag[j*ylcols+i];
        }

        z5_preds[i] = fitted(fit,inp,varcovar,var);
        z5[i] = z5_y2[i] - z5_preds[i];
    }

    //mdisplay(z5_preds,1,Nz5y);

    XX = (double*) malloc(sizeof(double)*(mfrows+2) * Ny);
    memcpy(XX,mf,sizeof(double)*mfrows*Ny);
    memcpy(XX+mfrows*Ny,z4,sizeof(double)*Ny);
    memcpy(XX+(mfrows+1)*Ny,z5,sizeof(double)*Ny);

    //mdisplay(XX,mfrows+2,Ny);
    //mdisplay(y,1,Ny);

    free(varcovar);
    free(res);

    p = mfrows+2;

    fitout = reg_init(Ny,p);
    setIntercept(fitout,0);

    varcovar = (double*)malloc(sizeof(double)*p*p);
    res = (double*)malloc(sizeof(double)*Ny);

    regress(fitout,XX,y2,res,varcovar,alpha);

	
    free(y_fdiff);
    free(varcovar);
    free(ylag);
    free(mf);
    free(res);
    free_reg(fit);
    free(z4_lag);
    free(inp);
    free(z4_preds);
    free(y);
    free(z5_y);
    free(z5_lag);
    free(z4);
    free(z5);
    free(z5_preds);
    free(XX);
 

    return fitout;
}